

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O2

void __thiscall
ContainerAlgorithms::
DefaultDeleter<std::map<const_cmTarget_*,_cmGeneratorTarget_*,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>,_true>
::operator()(DefaultDeleter<std::map<const_cmTarget_*,_cmGeneratorTarget_*,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>,_true>
             *this,value_type value)

{
  cmGeneratorTarget *this_00;
  
  this_00 = value.second;
  if (this_00 != (cmGeneratorTarget *)0x0) {
    cmGeneratorTarget::~cmGeneratorTarget(this_00);
  }
  operator_delete(this_00,0x138);
  return;
}

Assistant:

void operator()(typename Range::value_type value) const {
    delete value.second;
  }